

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::ReportFailureInUnknownLocation(Type result_type,String *message)

{
  String *message_00;
  UnitTest *this;
  undefined4 in_stack_ffffffffffffffb0;
  Type result_type_00;
  String local_28;
  String *local_18;
  String *message_local;
  Type result_type_local;
  
  local_18 = message;
  message_local._4_4_ = result_type;
  this = UnitTest::GetInstance();
  message_00 = local_18;
  result_type_00 = message_local._4_4_;
  String::String(&local_28);
  UnitTest::AddTestPartResult(this,result_type_00,(char *)0x0,-1,message_00,&local_28);
  String::~String((String *)CONCAT44(result_type_00,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void ReportFailureInUnknownLocation(TestPartResult::Type result_type,
                                    const String& message) {
  // This function is a friend of UnitTest and as such has access to
  // AddTestPartResult.
  UnitTest::GetInstance()->AddTestPartResult(
      result_type,
      NULL,  // No info about the source file where the exception occurred.
      -1,    // We have no info on which line caused the exception.
      message,
      String());  // No stack trace, either.
}